

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WeightParams * __thiscall
CoreML::Specification::GRULayerParams::mutable_resetgateweightmatrix(GRULayerParams *this)

{
  WeightParams *this_00;
  
  this_00 = this->resetgateweightmatrix_;
  if (this_00 == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->resetgateweightmatrix_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::WeightParams* GRULayerParams::mutable_resetgateweightmatrix() {
  
  if (resetgateweightmatrix_ == NULL) {
    resetgateweightmatrix_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.GRULayerParams.resetGateWeightMatrix)
  return resetgateweightmatrix_;
}